

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

el_action_t ed_next_line(EditLine *el,wint_t c)

{
  wchar_t wVar1;
  wchar_t *pwVar2;
  wchar_t wVar3;
  el_action_t eVar4;
  wchar_t *pwVar5;
  
  wVar3 = c_hpos(el);
  pwVar2 = (el->el_line).lastchar;
  for (pwVar5 = (el->el_line).cursor; pwVar5 < pwVar2; pwVar5 = pwVar5 + 1) {
    if ((*pwVar5 == L'\n') &&
       (wVar1 = (el->el_state).argument, (el->el_state).argument = wVar1 + L'\xffffffff',
       wVar1 < L'\x02')) goto LAB_001085d7;
  }
  eVar4 = '\x06';
  if ((el->el_state).argument < L'\x01') {
LAB_001085d7:
    do {
      pwVar5 = pwVar5 + 1;
      if ((wVar3 < L'\x01') || (pwVar2 <= pwVar5)) break;
      wVar3 = wVar3 + L'\xffffffff';
    } while (*pwVar5 != L'\n');
    (el->el_line).cursor = pwVar5;
    eVar4 = '\x05';
  }
  return eVar4;
}

Assistant:

libedit_private el_action_t
/*ARGSUSED*/
ed_next_line(EditLine *el, wint_t c __attribute__((__unused__)))
{
	wchar_t *ptr;
	int nchars = c_hpos(el);

	/*
         * Move to the line requested
         */
	for (ptr = el->el_line.cursor; ptr < el->el_line.lastchar; ptr++)
		if (*ptr == '\n' && --el->el_state.argument <= 0)
			break;

	if (el->el_state.argument > 0)
		return CC_ERROR;

	/*
         * Move to the character requested
         */
	for (ptr++;
	    nchars-- > 0 && ptr < el->el_line.lastchar && *ptr != '\n';
	    ptr++)
		continue;

	el->el_line.cursor = ptr;
	return CC_CURSOR;
}